

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CivetServer.cpp
# Opt level: O3

void CivetServer::urlEncode(char *src,size_t src_len,string *dst,bool append)

{
  undefined8 uVar1;
  int iVar2;
  undefined8 in_RAX;
  out_of_range *this;
  undefined3 in_register_00000009;
  size_t sVar3;
  char buf [2];
  char dst_buf [4];
  undefined8 uStack_38;
  
  if (CONCAT31(in_register_00000009,append) == 0) {
    dst->_M_string_length = 0;
    *(dst->_M_dataplus)._M_p = '\0';
  }
  if (src_len != 0) {
    sVar3 = 0;
    uStack_38 = in_RAX;
    do {
      uVar1 = uStack_38;
      if (src[sVar3] == '\0') {
        std::__cxx11::string::push_back((char)dst);
      }
      else {
        uStack_38._4_4_ = SUB84(uVar1,4);
        uStack_38._0_4_ = (uint)CONCAT12(src[sVar3],(undefined2)uStack_38);
        iVar2 = mg_url_encode((char *)((long)&uStack_38 + 2),(char *)((long)&uStack_38 + 4),4);
        if (iVar2 < 0) {
          this = (out_of_range *)__cxa_allocate_exception(0x10);
          std::out_of_range::out_of_range(this,"");
          __cxa_throw(this,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
        }
        std::__cxx11::string::append((char *)dst);
      }
      sVar3 = sVar3 + 1;
    } while (src_len != sVar3);
  }
  return;
}

Assistant:

void
CivetServer::urlEncode(const char *src,
                       size_t src_len,
                       std::string &dst,
                       bool append)
{
	if (!append)
		dst.clear();

	for (; src_len > 0; src++, src_len--) {
		if (*src == '\0') {
			// src and dst can contain NUL characters without encoding
			dst.push_back(*src);
		} else {
			char buf[2] = {*src, '\0'};
			char dst_buf[4];
			if (mg_url_encode(buf, dst_buf, sizeof(dst_buf)) < 0) {
				// never reach here
				throw std::out_of_range("");
			}
			dst.append(dst_buf);
		}
	}
}